

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

quat quat_create_from_axis_angle(vec3 axis,float angle)

{
  float fVar1;
  float fVar2;
  quat qVar3;
  vec3 vVar4;
  undefined8 local_28;
  
  vVar4 = vec3_normalize(axis);
  fVar1 = sinf(angle * 0.5);
  qVar3.z = vVar4.z * fVar1;
  local_28._0_4_ = vVar4.x;
  local_28._4_4_ = vVar4.y;
  fVar2 = cosf(angle * 0.5);
  qVar3.w = fVar2;
  qVar3.x = fVar1 * (float)local_28;
  qVar3.y = fVar1 * local_28._4_4_;
  return qVar3;
}

Assistant:

quat quat_create_from_axis_angle(vec3 axis, float angle) {
    axis = vec3_normalize(axis);
    float temp = sinf(angle / 2.0f);
    float x = temp * axis.x;
    float y = temp * axis.y;
    float z = temp * axis.z;
    float w = cosf(angle / 2.0f);
    return quat_create(x, y, z, w);
}